

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowLeadLagGlobalState::WindowLeadLagGlobalState
          (WindowLeadLagGlobalState *this,WindowValueExecutor *executor,idx_t payload_count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  BoundWindowExpression *pBVar1;
  ClientContext *context;
  ClientConfig *pCVar2;
  idx_t iVar3;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> this_00;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var4;
  
  WindowValueGlobalState::WindowValueGlobalState
            (&this->super_WindowValueGlobalState,executor,payload_count,partition_mask,order_mask);
  (this->super_WindowValueGlobalState).super_WindowExecutorGlobalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowLeadLagGlobalState_0248a9a0;
  this->use_framing = false;
  (this->row_tree).
  super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>.
  super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = (WindowTokenTree *)0x0;
  if ((this->super_WindowValueGlobalState).value_tree.
      super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
      .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl ==
      (WindowIndexTree *)0x0) {
    return;
  }
  this->use_framing = true;
  pBVar1 = (executor->super_WindowExecutor).wexpr;
  pCVar2 = ClientConfig::GetConfig((executor->super_WindowExecutor).context);
  if ((pCVar2->enable_optimizer == true) &&
     (iVar3 = BoundWindowExpression::GetSharedOrders(&pBVar1->orders,&pBVar1->arg_orders),
     iVar3 == ((long)(pBVar1->arg_orders).
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     .
                     super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar1->arg_orders).
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     .
                     super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    _Var4._M_head_impl =
         (WindowTokenTree *)
         (this->super_WindowValueGlobalState).value_tree.
         super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
         .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl;
    (this->super_WindowValueGlobalState).value_tree.
    super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
    .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl = (WindowIndexTree *)0x0;
  }
  else {
    context = (executor->super_WindowExecutor).context;
    this_00._M_head_impl = (WindowTokenTree *)operator_new(0xd8);
    WindowMergeSortTree::WindowMergeSortTree
              ((WindowMergeSortTree *)this_00._M_head_impl,context,&pBVar1->arg_orders,
               &executor->arg_order_idx,payload_count,true);
    ((this_00._M_head_impl)->super_WindowMergeSortTree)._vptr_WindowMergeSortTree =
         &PTR__WindowTokenTree_0248a318;
    ((WindowMergeSortTree *)&(this_00._M_head_impl)->deltas)->_vptr_WindowMergeSortTree =
         (_func_int **)0x0;
    *(ClientContext **)((long)&(this_00._M_head_impl)->deltas + 8) = (ClientContext *)0x0;
    *(pointer *)((long)&(this_00._M_head_impl)->deltas + 0x10) = (pointer)0x0;
    _Var4._M_head_impl =
         (this->row_tree).
         super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
         .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl;
    (this->row_tree).
    super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
    .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = this_00._M_head_impl;
  }
  if (_Var4._M_head_impl == (WindowTokenTree *)0x0) {
    return;
  }
  (**(code **)((long)((_Var4._M_head_impl)->super_WindowMergeSortTree)._vptr_WindowMergeSortTree + 8
              ))();
  return;
}

Assistant:

explicit WindowLeadLagGlobalState(const WindowValueExecutor &executor, const idx_t payload_count,
	                                  const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowValueGlobalState(executor, payload_count, partition_mask, order_mask) {

		if (value_tree) {
			use_framing = true;

			//	If the argument order is prefix of the partition ordering,
			//	then we can just use the partition ordering.
			auto &wexpr = executor.wexpr;
			auto &arg_orders = executor.wexpr.arg_orders;
			const auto optimize = ClientConfig::GetConfig(executor.context).enable_optimizer;
			if (!optimize || BoundWindowExpression::GetSharedOrders(wexpr.orders, arg_orders) != arg_orders.size()) {
				//	"The ROW_NUMBER function can be computed by disambiguating duplicate elements based on their
				//	position in the input data, such that two elements never compare as equal."
				// 	Note: If the user specifies an partial secondary sort, the disambiguation will use the
				//	partition's row numbers, not the secondary sort's row numbers.
				row_tree = make_uniq<WindowTokenTree>(executor.context, arg_orders, executor.arg_order_idx,
				                                      payload_count, true);
			} else {
				// The value_tree is cheap to construct, so we just get rid of it if we now discover we don't need it.
				value_tree.reset();
			}
		}
	}